

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_trace_striped_sse2_128_16.c
# Opt level: O2

parasail_result_t *
parasail_sw_trace_striped_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort uVar1;
  undefined8 *puVar3;
  ushort *puVar4;
  ushort *puVar5;
  short *psVar6;
  uint uVar7;
  void *pvVar8;
  parasail_matrix_t *ppVar9;
  int *piVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  __m128i *palVar20;
  uint uVar21;
  int iVar22;
  parasail_result_t *result;
  __m128i *b;
  __m128i *palVar23;
  __m128i *b_00;
  __m128i *palVar24;
  __m128i *ptr;
  __m128i *ptr_00;
  long lVar25;
  ulong uVar26;
  int iVar27;
  undefined8 uVar28;
  long lVar29;
  long lVar30;
  char *pcVar31;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  char *__format;
  uint a;
  long lVar32;
  int iVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  bool bVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined1 auVar41 [16];
  ulong uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 in_XMM3 [16];
  short sVar45;
  short sVar49;
  short sVar50;
  short sVar51;
  short sVar52;
  short sVar53;
  short sVar54;
  short sVar55;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  ushort uVar62;
  ushort uVar63;
  short sVar64;
  short sVar69;
  short sVar70;
  short sVar71;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  ushort uVar72;
  ushort uVar73;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  undefined1 auVar74 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  int local_108;
  undefined4 local_f4;
  __m128i *local_f0;
  ulong local_e8;
  long local_e0;
  __m128i *local_d8;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined1 local_58 [16];
  ushort uVar2;
  size_t len;
  
  local_e8 = (ulong)(uint)s2Len;
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar31 = "profile";
  }
  else {
    pvVar8 = (profile->profile16).score;
    if (pvVar8 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar31 = "profile->profile16.score";
    }
    else {
      ppVar9 = profile->matrix;
      if (ppVar9 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar31 = "profile->matrix";
      }
      else {
        uVar7 = profile->s1Len;
        if ((int)uVar7 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar31 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar31 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar31 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar31 = "open";
        }
        else {
          if (-1 < gap) {
            uVar37 = (ulong)uVar7 + 7 >> 3;
            iVar22 = ppVar9->max;
            uVar28 = 0x10;
            a = (uint)uVar37;
            result = parasail_result_new_trace(a,s2Len,0x10,0x10);
            if (result == (parasail_result_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            result->flag = result->flag | 0x8280804;
            b = parasail_memalign___m128i(0x10,uVar37);
            palVar23 = parasail_memalign___m128i(0x10,uVar37);
            b_00 = parasail_memalign___m128i(0x10,uVar37);
            palVar24 = parasail_memalign___m128i(0x10,uVar37);
            ptr = parasail_memalign___m128i(0x10,uVar37);
            ptr_00 = parasail_memalign___m128i(0x10,uVar37);
            local_f0 = parasail_memalign___m128i(0x10,uVar37);
            auVar41._0_4_ = -(uint)((int)((ulong)b >> 0x20) == 0 && (int)b == 0);
            auVar41._4_4_ = -(uint)((int)palVar23 == 0 && (int)((ulong)palVar23 >> 0x20) == 0);
            auVar41._8_4_ = -(uint)((int)b_00 == 0 && (int)((ulong)b_00 >> 0x20) == 0);
            auVar41._12_4_ = -(uint)((int)palVar24 == 0 && (int)((ulong)palVar24 >> 0x20) == 0);
            iVar27 = movmskps((int)uVar28,auVar41);
            len = CONCAT44((int)((ulong)uVar28 >> 0x20),iVar27);
            if (iVar27 != 0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_00 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (local_f0 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            auVar41 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
            uVar39 = auVar41._0_4_;
            auVar41 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
            uVar40 = auVar41._0_4_;
            c[1] = extraout_RDX;
            c[0] = uVar37;
            parasail_memset___m128i(b,c,len);
            uVar21 = -open;
            pshuflw(ZEXT416(uVar21),ZEXT416(uVar21),0);
            c_00[1] = extraout_RDX_00;
            c_00[0] = uVar37;
            parasail_memset___m128i(b_00,c_00,len);
            c_01[1] = extraout_RDX_01;
            c_01[0] = uVar37;
            parasail_memset___m128i(palVar24,c_01,len);
            lVar32 = uVar37 * 0x10;
            for (lVar25 = 0; lVar32 != lVar25; lVar25 = lVar25 + 0x10) {
              puVar3 = (undefined8 *)((long)((result->field_4).rowcols)->score_row + lVar25);
              *puVar3 = 0x8000800080008;
              puVar3[1] = 0x8000800080008;
            }
            auVar65._4_4_ = uVar39;
            auVar65._0_4_ = uVar39;
            auVar65._8_4_ = uVar39;
            auVar65._12_4_ = uVar39;
            auVar41 = psubsw((undefined1  [16])0x0,auVar65);
            uVar35 = 0;
            local_f4 = 0x8000;
            local_58 = (undefined1  [16])0x0;
            uVar56 = 0;
            uVar57 = 0;
            uVar58 = 0;
            uVar59 = 0;
            uVar60 = 0;
            uVar61 = 0;
            uVar62 = 0;
            uVar63 = 0;
            local_108 = 0;
            auVar87 = auVar41;
            do {
              local_e0 = (uVar35 + 1) * lVar32;
              lVar25 = lVar32 * uVar35;
              palVar20 = ptr;
              local_d8 = palVar23;
              do {
                palVar23 = b;
                uVar34 = uVar35;
                ptr = palVar24;
                palVar24 = palVar20;
                if (uVar34 == (uint)s2Len) {
                  local_b8 = SUB84(palVar24,0);
                  uStack_b4 = (undefined4)((ulong)palVar24 >> 0x20);
                  b = palVar23;
                  goto LAB_006113ba;
                }
                uVar35 = palVar23[a - 1][0];
                auVar67._0_8_ = uVar35 << 0x10;
                auVar67._8_8_ = palVar23[a - 1][1] << 0x10 | uVar35 >> 0x30;
                iVar27 = ppVar9->mapper[(byte)s2[uVar34]] * a;
                iVar33 = (int)uVar34 + -2;
                b = local_d8;
                if (local_108 == iVar33) {
                  b = local_f0;
                }
                uVar35 = uVar34 + 1;
                uVar26 = 1;
                auVar17._4_4_ = uVar40;
                auVar17._0_4_ = uVar40;
                auVar17._8_4_ = uVar40;
                auVar17._12_4_ = uVar40;
                auVar46 = auVar41;
                for (lVar29 = 0; lVar32 != lVar29; lVar29 = lVar29 + 0x10) {
                  auVar65 = *(undefined1 (*) [16])((long)*b_00 + lVar29);
                  auVar87 = paddsw(auVar67,*(undefined1 (*) [16])
                                            ((long)pvVar8 + lVar29 + (long)iVar27 * 0x10));
                  uVar78 = (ushort)(-1 < auVar87._0_2_) * auVar87._0_2_;
                  uVar73 = (ushort)(-1 < auVar87._2_2_) * auVar87._2_2_;
                  uVar80 = (ushort)(-1 < auVar87._4_2_) * auVar87._4_2_;
                  uVar82 = (ushort)(-1 < auVar87._6_2_) * auVar87._6_2_;
                  uVar84 = (ushort)(-1 < auVar87._8_2_) * auVar87._8_2_;
                  uVar1 = (ushort)(-1 < auVar87._10_2_) * auVar87._10_2_;
                  uVar2 = (ushort)(-1 < auVar87._12_2_) * auVar87._12_2_;
                  uVar76 = (ushort)(-1 < auVar87._14_2_) * auVar87._14_2_;
                  sVar11 = auVar65._0_2_;
                  uVar72 = (ushort)((short)uVar78 < sVar11) * sVar11 |
                           ((short)uVar78 >= sVar11) * uVar78;
                  sVar11 = auVar65._2_2_;
                  uVar75 = (ushort)((short)uVar73 < sVar11) * sVar11 |
                           ((short)uVar73 >= sVar11) * uVar73;
                  sVar11 = auVar65._4_2_;
                  uVar77 = (ushort)((short)uVar80 < sVar11) * sVar11 |
                           ((short)uVar80 >= sVar11) * uVar80;
                  sVar11 = auVar65._6_2_;
                  uVar79 = (ushort)((short)uVar82 < sVar11) * sVar11 |
                           ((short)uVar82 >= sVar11) * uVar82;
                  sVar11 = auVar65._8_2_;
                  uVar81 = (ushort)((short)uVar84 < sVar11) * sVar11 |
                           ((short)uVar84 >= sVar11) * uVar84;
                  sVar11 = auVar65._10_2_;
                  uVar83 = (ushort)((short)uVar1 < sVar11) * sVar11 |
                           ((short)uVar1 >= sVar11) * uVar1;
                  sVar11 = auVar65._12_2_;
                  uVar85 = (ushort)((short)uVar2 < sVar11) * sVar11 |
                           ((short)uVar2 >= sVar11) * uVar2;
                  sVar11 = auVar65._14_2_;
                  uVar86 = (ushort)((short)uVar76 < sVar11) * sVar11 |
                           ((short)uVar76 >= sVar11) * uVar76;
                  sVar11 = auVar46._0_2_;
                  auVar43._0_2_ =
                       (ushort)((short)uVar72 < sVar11) * sVar11 |
                       ((short)uVar72 >= sVar11) * uVar72;
                  sVar64 = auVar46._2_2_;
                  auVar43._2_2_ =
                       (ushort)((short)uVar75 < sVar64) * sVar64 |
                       ((short)uVar75 >= sVar64) * uVar75;
                  sVar12 = auVar46._4_2_;
                  auVar43._4_2_ =
                       (ushort)((short)uVar77 < sVar12) * sVar12 |
                       ((short)uVar77 >= sVar12) * uVar77;
                  sVar69 = auVar46._6_2_;
                  auVar43._6_2_ =
                       (ushort)((short)uVar79 < sVar69) * sVar69 |
                       ((short)uVar79 >= sVar69) * uVar79;
                  sVar13 = auVar46._8_2_;
                  auVar43._8_2_ =
                       (ushort)((short)uVar81 < sVar13) * sVar13 |
                       ((short)uVar81 >= sVar13) * uVar81;
                  sVar70 = auVar46._10_2_;
                  auVar43._10_2_ =
                       (ushort)((short)uVar83 < sVar70) * sVar70 |
                       ((short)uVar83 >= sVar70) * uVar83;
                  sVar14 = auVar46._12_2_;
                  auVar43._12_2_ =
                       (ushort)((short)uVar85 < sVar14) * sVar14 |
                       ((short)uVar85 >= sVar14) * uVar85;
                  sVar71 = auVar46._14_2_;
                  auVar43._14_2_ =
                       (ushort)((short)uVar86 < sVar71) * sVar71 |
                       ((short)uVar86 >= sVar71) * uVar86;
                  *(undefined1 (*) [16])((long)*b + lVar29) = auVar43;
                  uVar72 = ~-(ushort)(uVar78 == auVar43._0_2_) & 2 - (sVar11 < (short)uVar72) |
                           -(ushort)(0 < (short)auVar43._0_2_ && uVar78 == auVar43._0_2_) & 4;
                  uVar75 = ~-(ushort)(uVar73 == auVar43._2_2_) & 2 - (sVar64 < (short)uVar75) |
                           -(ushort)(0 < (short)auVar43._2_2_ && uVar73 == auVar43._2_2_) & 4;
                  uVar77 = ~-(ushort)(uVar80 == auVar43._4_2_) & 2 - (sVar12 < (short)uVar77) |
                           -(ushort)(0 < (short)auVar43._4_2_ && uVar80 == auVar43._4_2_) & 4;
                  uVar79 = ~-(ushort)(uVar82 == auVar43._6_2_) & 2 - (sVar69 < (short)uVar79) |
                           -(ushort)(0 < (short)auVar43._6_2_ && uVar82 == auVar43._6_2_) & 4;
                  uVar81 = ~-(ushort)(uVar84 == auVar43._8_2_) & 2 - (sVar13 < (short)uVar81) |
                           -(ushort)(0 < (short)auVar43._8_2_ && uVar84 == auVar43._8_2_) & 4;
                  uVar83 = ~-(ushort)(uVar1 == auVar43._10_2_) & 2 - (sVar70 < (short)uVar83) |
                           -(ushort)(0 < (short)auVar43._10_2_ && uVar1 == auVar43._10_2_) & 4;
                  uVar85 = ~-(ushort)(uVar2 == auVar43._12_2_) & 2 - (sVar14 < (short)uVar85) |
                           -(ushort)(0 < (short)auVar43._12_2_ && uVar2 == auVar43._12_2_) & 4;
                  uVar86 = ~-(ushort)(uVar76 == auVar43._14_2_) & 2 - (sVar71 < (short)uVar86) |
                           -(ushort)(0 < (short)auVar43._14_2_ && uVar76 == auVar43._14_2_) & 4;
                  puVar4 = (ushort *)
                           ((long)((result->field_4).rowcols)->score_row + lVar29 + lVar25);
                  uVar73 = *puVar4;
                  uVar76 = puVar4[1];
                  uVar78 = puVar4[2];
                  uVar80 = puVar4[3];
                  uVar82 = puVar4[4];
                  uVar84 = puVar4[5];
                  uVar1 = puVar4[6];
                  uVar2 = puVar4[7];
                  puVar4 = (ushort *)((long)*ptr_00 + lVar29);
                  *puVar4 = uVar72;
                  puVar4[1] = uVar75;
                  puVar4[2] = uVar77;
                  puVar4[3] = uVar79;
                  puVar4[4] = uVar81;
                  puVar4[5] = uVar83;
                  puVar4[6] = uVar85;
                  puVar4[7] = uVar86;
                  puVar4 = (ushort *)
                           ((long)((result->field_4).rowcols)->score_row + lVar29 + lVar25);
                  *puVar4 = uVar73 | uVar72;
                  puVar4[1] = uVar76 | uVar75;
                  puVar4[2] = uVar78 | uVar77;
                  puVar4[3] = uVar80 | uVar79;
                  puVar4[4] = uVar82 | uVar81;
                  puVar4[5] = uVar84 | uVar83;
                  puVar4[6] = uVar1 | uVar85;
                  puVar4[7] = uVar2 | uVar86;
                  auVar15._4_4_ = uVar39;
                  auVar15._0_4_ = uVar39;
                  auVar15._8_4_ = uVar39;
                  auVar15._12_4_ = uVar39;
                  in_XMM3 = psubsw(auVar43,auVar15);
                  auVar65 = psubsw(auVar65,auVar17);
                  sVar11 = in_XMM3._0_2_;
                  sVar64 = auVar65._0_2_;
                  sVar12 = in_XMM3._2_2_;
                  sVar69 = auVar65._2_2_;
                  sVar13 = in_XMM3._4_2_;
                  sVar70 = auVar65._4_2_;
                  sVar14 = in_XMM3._6_2_;
                  sVar71 = auVar65._6_2_;
                  sVar45 = in_XMM3._8_2_;
                  sVar49 = auVar65._8_2_;
                  sVar50 = in_XMM3._10_2_;
                  sVar51 = auVar65._10_2_;
                  sVar52 = in_XMM3._12_2_;
                  sVar53 = auVar65._12_2_;
                  sVar55 = auVar65._14_2_;
                  sVar54 = in_XMM3._14_2_;
                  puVar4 = (ushort *)((long)*b_00 + lVar29);
                  *puVar4 = (ushort)(sVar64 < sVar11) * sVar11 | (ushort)(sVar64 >= sVar11) * sVar64
                  ;
                  puVar4[1] = (ushort)(sVar69 < sVar12) * sVar12 |
                              (ushort)(sVar69 >= sVar12) * sVar69;
                  puVar4[2] = (ushort)(sVar70 < sVar13) * sVar13 |
                              (ushort)(sVar70 >= sVar13) * sVar70;
                  puVar4[3] = (ushort)(sVar71 < sVar14) * sVar14 |
                              (ushort)(sVar71 >= sVar14) * sVar71;
                  puVar4[4] = (ushort)(sVar49 < sVar45) * sVar45 |
                              (ushort)(sVar49 >= sVar45) * sVar49;
                  puVar4[5] = (ushort)(sVar51 < sVar50) * sVar50 |
                              (ushort)(sVar51 >= sVar50) * sVar51;
                  puVar4[6] = (ushort)(sVar53 < sVar52) * sVar52 |
                              (ushort)(sVar53 >= sVar52) * sVar53;
                  puVar4[7] = (ushort)(sVar55 < sVar54) * sVar54 |
                              (ushort)(sVar55 >= sVar54) * sVar55;
                  auVar65 = psubsw(*(undefined1 (*) [16])((long)*ptr + lVar29),auVar17);
                  sVar64 = auVar65._0_2_;
                  sVar69 = auVar65._2_2_;
                  sVar70 = auVar65._4_2_;
                  sVar71 = auVar65._6_2_;
                  sVar49 = auVar65._8_2_;
                  sVar51 = auVar65._10_2_;
                  sVar53 = auVar65._12_2_;
                  sVar55 = auVar65._14_2_;
                  puVar4 = (ushort *)((long)*palVar24 + lVar29);
                  *puVar4 = (ushort)(sVar11 < sVar64) * sVar64 | (ushort)(sVar11 >= sVar64) * sVar11
                  ;
                  puVar4[1] = (ushort)(sVar12 < sVar69) * sVar69 |
                              (ushort)(sVar12 >= sVar69) * sVar12;
                  puVar4[2] = (ushort)(sVar13 < sVar70) * sVar70 |
                              (ushort)(sVar13 >= sVar70) * sVar13;
                  puVar4[3] = (ushort)(sVar14 < sVar71) * sVar71 |
                              (ushort)(sVar14 >= sVar71) * sVar14;
                  puVar4[4] = (ushort)(sVar45 < sVar49) * sVar49 |
                              (ushort)(sVar45 >= sVar49) * sVar45;
                  puVar4[5] = (ushort)(sVar50 < sVar51) * sVar51 |
                              (ushort)(sVar50 >= sVar51) * sVar50;
                  puVar4[6] = (ushort)(sVar52 < sVar53) * sVar53 |
                              (ushort)(sVar52 >= sVar53) * sVar52;
                  puVar4[7] = (ushort)(sVar54 < sVar55) * sVar55 |
                              (ushort)(sVar54 >= sVar55) * sVar54;
                  if ((int)uVar35 < s2Len) {
                    puVar4 = (ushort *)
                             ((long)((result->field_4).rowcols)->score_row + lVar29 + local_e0);
                    *puVar4 = -(ushort)(sVar64 < sVar11) & 0x18 ^ 0x10;
                    puVar4[1] = -(ushort)(sVar69 < sVar12) & 0x18 ^ 0x10;
                    puVar4[2] = -(ushort)(sVar70 < sVar13) & 0x18 ^ 0x10;
                    puVar4[3] = -(ushort)(sVar71 < sVar14) & 0x18 ^ 0x10;
                    puVar4[4] = -(ushort)(sVar49 < sVar45) & 0x18 ^ 0x10;
                    puVar4[5] = -(ushort)(sVar51 < sVar50) & 0x18 ^ 0x10;
                    puVar4[6] = -(ushort)(sVar53 < sVar52) & 0x18 ^ 0x10;
                    puVar4[7] = -(ushort)(sVar55 < sVar54) & 0x18 ^ 0x10;
                  }
                  auVar87 = psubsw(auVar46,auVar17);
                  sVar64 = auVar87._0_2_;
                  sVar69 = auVar87._2_2_;
                  sVar70 = auVar87._4_2_;
                  sVar71 = auVar87._6_2_;
                  sVar49 = auVar87._8_2_;
                  sVar51 = auVar87._10_2_;
                  sVar53 = auVar87._12_2_;
                  sVar55 = auVar87._14_2_;
                  if (uVar26 < uVar37) {
                    piVar10 = ((result->field_4).rowcols)->score_row;
                    puVar4 = (ushort *)((long)piVar10 + lVar29 + 0x10 + lVar25);
                    uVar73 = puVar4[1];
                    uVar76 = puVar4[2];
                    uVar78 = puVar4[3];
                    uVar80 = puVar4[4];
                    uVar82 = puVar4[5];
                    uVar84 = puVar4[6];
                    uVar1 = puVar4[7];
                    puVar5 = (ushort *)((long)piVar10 + lVar29 + 0x10 + lVar25);
                    *puVar5 = -(ushort)(sVar64 < sVar11) & 0x60 ^ 0x40 | *puVar4;
                    puVar5[1] = -(ushort)(sVar69 < sVar12) & 0x60 ^ 0x40 | uVar73;
                    puVar5[2] = -(ushort)(sVar70 < sVar13) & 0x60 ^ 0x40 | uVar76;
                    puVar5[3] = -(ushort)(sVar71 < sVar14) & 0x60 ^ 0x40 | uVar78;
                    puVar5[4] = -(ushort)(sVar49 < sVar45) & 0x60 ^ 0x40 | uVar80;
                    puVar5[5] = -(ushort)(sVar51 < sVar50) & 0x60 ^ 0x40 | uVar82;
                    puVar5[6] = -(ushort)(sVar53 < sVar52) & 0x60 ^ 0x40 | uVar84;
                    puVar5[7] = -(ushort)(sVar55 < sVar54) & 0x60 ^ 0x40 | uVar1;
                  }
                  uVar56 = ((short)uVar56 < (short)auVar43._0_2_) * auVar43._0_2_ |
                           ((short)uVar56 >= (short)auVar43._0_2_) * uVar56;
                  uVar57 = ((short)uVar57 < (short)auVar43._2_2_) * auVar43._2_2_ |
                           ((short)uVar57 >= (short)auVar43._2_2_) * uVar57;
                  uVar58 = ((short)uVar58 < (short)auVar43._4_2_) * auVar43._4_2_ |
                           ((short)uVar58 >= (short)auVar43._4_2_) * uVar58;
                  uVar59 = ((short)uVar59 < (short)auVar43._6_2_) * auVar43._6_2_ |
                           ((short)uVar59 >= (short)auVar43._6_2_) * uVar59;
                  uVar60 = ((short)uVar60 < (short)auVar43._8_2_) * auVar43._8_2_ |
                           ((short)uVar60 >= (short)auVar43._8_2_) * uVar60;
                  uVar61 = ((short)uVar61 < (short)auVar43._10_2_) * auVar43._10_2_ |
                           ((short)uVar61 >= (short)auVar43._10_2_) * uVar61;
                  uVar62 = ((short)uVar62 < (short)auVar43._12_2_) * auVar43._12_2_ |
                           ((short)uVar62 >= (short)auVar43._12_2_) * uVar62;
                  uVar63 = ((short)uVar63 < (short)auVar43._14_2_) * auVar43._14_2_ |
                           ((short)uVar63 >= (short)auVar43._14_2_) * uVar63;
                  auVar46._0_2_ =
                       (ushort)(sVar11 < sVar64) * sVar64 | (ushort)(sVar11 >= sVar64) * sVar11;
                  auVar46._2_2_ =
                       (ushort)(sVar12 < sVar69) * sVar69 | (ushort)(sVar12 >= sVar69) * sVar12;
                  auVar46._4_2_ =
                       (ushort)(sVar13 < sVar70) * sVar70 | (ushort)(sVar13 >= sVar70) * sVar13;
                  auVar46._6_2_ =
                       (ushort)(sVar14 < sVar71) * sVar71 | (ushort)(sVar14 >= sVar71) * sVar14;
                  auVar46._8_2_ =
                       (ushort)(sVar45 < sVar49) * sVar49 | (ushort)(sVar45 >= sVar49) * sVar45;
                  auVar46._10_2_ =
                       (ushort)(sVar50 < sVar51) * sVar51 | (ushort)(sVar50 >= sVar51) * sVar50;
                  auVar46._12_2_ =
                       (ushort)(sVar52 < sVar53) * sVar53 | (ushort)(sVar52 >= sVar53) * sVar52;
                  auVar46._14_2_ =
                       (ushort)(sVar54 < sVar55) * sVar55 | (ushort)(sVar54 >= sVar55) * sVar54;
                  auVar67 = *(undefined1 (*) [16])((long)*palVar23 + lVar29);
                  uVar26 = uVar26 + 1;
                }
                if (local_108 == iVar33) {
                  local_f0 = local_d8;
                }
                auVar89 = auVar87;
                auVar65 = auVar46;
                for (iVar33 = 0; iVar33 != 8; iVar33 = iVar33 + 1) {
                  uVar26 = in_XMM3._0_8_;
                  in_XMM3._8_8_ = in_XMM3._8_8_ << 0x10 | uVar26 >> 0x30;
                  uVar73 = (ushort)uVar21;
                  in_XMM3._0_8_ = uVar26 << 0x10 | (ulong)uVar73;
                  uVar26 = auVar89._0_8_;
                  auVar89._8_8_ = auVar89._8_8_ << 0x10 | uVar26 >> 0x30;
                  auVar89._0_8_ = uVar26 << 0x10 | 0x8000;
                  auVar88._8_8_ = auVar65._8_8_ << 0x10 | auVar65._0_8_ >> 0x30;
                  auVar88._0_8_ = auVar65._0_8_ << 0x10 | (ulong)uVar73;
                  uVar26 = palVar23[a - 1][0];
                  uVar42 = auVar87._0_8_;
                  auVar87._8_8_ = auVar87._8_8_ << 0x10 | uVar42 >> 0x30;
                  auVar87._0_8_ = uVar42 << 0x10 | 0x8000;
                  auVar66._0_8_ = uVar26 << 0x10;
                  auVar66._8_8_ = palVar23[a - 1][1] << 0x10 | uVar26 >> 0x30;
                  uVar26 = auVar46._0_8_;
                  auVar46._8_8_ = auVar46._8_8_ << 0x10 | uVar26 >> 0x30;
                  auVar46._0_8_ = uVar26 << 0x10 | (ulong)uVar73;
                  lVar30 = 0;
                  lVar29 = lVar25;
                  uVar26 = uVar37;
                  lVar36 = local_e0;
                  auVar65 = auVar88;
                  while (bVar38 = uVar26 != 0, uVar26 = uVar26 - 1, bVar38) {
                    psVar6 = (short *)((long)*b + lVar30);
                    sVar45 = *psVar6;
                    sVar49 = psVar6[1];
                    sVar50 = psVar6[2];
                    sVar51 = psVar6[3];
                    sVar52 = psVar6[4];
                    sVar53 = psVar6[5];
                    sVar54 = psVar6[6];
                    sVar55 = psVar6[7];
                    sVar11 = auVar65._0_2_;
                    auVar74._0_2_ =
                         (ushort)(sVar45 < sVar11) * sVar11 | (ushort)(sVar45 >= sVar11) * sVar45;
                    sVar64 = auVar65._2_2_;
                    auVar74._2_2_ =
                         (ushort)(sVar49 < sVar64) * sVar64 | (ushort)(sVar49 >= sVar64) * sVar49;
                    sVar12 = auVar65._4_2_;
                    auVar74._4_2_ =
                         (ushort)(sVar50 < sVar12) * sVar12 | (ushort)(sVar50 >= sVar12) * sVar50;
                    sVar69 = auVar65._6_2_;
                    auVar74._6_2_ =
                         (ushort)(sVar51 < sVar69) * sVar69 | (ushort)(sVar51 >= sVar69) * sVar51;
                    sVar13 = auVar65._8_2_;
                    auVar74._8_2_ =
                         (ushort)(sVar52 < sVar13) * sVar13 | (ushort)(sVar52 >= sVar13) * sVar52;
                    sVar70 = auVar65._10_2_;
                    auVar74._10_2_ =
                         (ushort)(sVar53 < sVar70) * sVar70 | (ushort)(sVar53 >= sVar70) * sVar53;
                    sVar14 = auVar65._12_2_;
                    auVar74._12_2_ =
                         (ushort)(sVar54 < sVar14) * sVar14 | (ushort)(sVar54 >= sVar14) * sVar54;
                    sVar71 = auVar65._14_2_;
                    auVar74._14_2_ =
                         (ushort)(sVar55 < sVar71) * sVar71 | (ushort)(sVar55 >= sVar71) * sVar55;
                    *(undefined1 (*) [16])((long)*b + lVar30) = auVar74;
                    auVar67 = paddsw(auVar66,*(undefined1 (*) [16])
                                              ((long)pvVar8 + lVar30 + (long)iVar27 * 0x10));
                    uVar72 = -(ushort)(sVar11 < sVar45 ||
                                      (ushort)((ushort)(-1 < auVar67._0_2_) * auVar67._0_2_) ==
                                      auVar74._0_2_);
                    uVar75 = -(ushort)(sVar64 < sVar49 ||
                                      (ushort)((ushort)(-1 < auVar67._2_2_) * auVar67._2_2_) ==
                                      auVar74._2_2_);
                    uVar77 = -(ushort)(sVar12 < sVar50 ||
                                      (ushort)((ushort)(-1 < auVar67._4_2_) * auVar67._4_2_) ==
                                      auVar74._4_2_);
                    uVar79 = -(ushort)(sVar69 < sVar51 ||
                                      (ushort)((ushort)(-1 < auVar67._6_2_) * auVar67._6_2_) ==
                                      auVar74._6_2_);
                    uVar81 = -(ushort)(sVar13 < sVar52 ||
                                      (ushort)((ushort)(-1 < auVar67._8_2_) * auVar67._8_2_) ==
                                      auVar74._8_2_);
                    uVar83 = -(ushort)(sVar70 < sVar53 ||
                                      (ushort)((ushort)(-1 < auVar67._10_2_) * auVar67._10_2_) ==
                                      auVar74._10_2_);
                    uVar85 = -(ushort)(sVar14 < sVar54 ||
                                      (ushort)((ushort)(-1 < auVar67._12_2_) * auVar67._12_2_) ==
                                      auVar74._12_2_);
                    uVar86 = -(ushort)(sVar71 < sVar55 ||
                                      (ushort)((ushort)(-1 < auVar67._14_2_) * auVar67._14_2_) ==
                                      auVar74._14_2_);
                    puVar4 = (ushort *)((long)((result->field_4).rowcols)->score_row + lVar29);
                    uVar73 = *puVar4;
                    uVar76 = puVar4[1];
                    uVar78 = puVar4[2];
                    uVar80 = puVar4[3];
                    uVar82 = puVar4[4];
                    uVar84 = puVar4[5];
                    uVar1 = puVar4[6];
                    uVar2 = puVar4[7];
                    puVar4 = (ushort *)((long)*ptr_00 + lVar30);
                    uVar72 = ~uVar72 & 2 | *puVar4 & uVar72;
                    uVar75 = ~uVar75 & 2 | puVar4[1] & uVar75;
                    uVar77 = ~uVar77 & 2 | puVar4[2] & uVar77;
                    uVar79 = ~uVar79 & 2 | puVar4[3] & uVar79;
                    uVar81 = ~uVar81 & 2 | puVar4[4] & uVar81;
                    uVar83 = ~uVar83 & 2 | puVar4[5] & uVar83;
                    uVar85 = ~uVar85 & 2 | puVar4[6] & uVar85;
                    uVar86 = ~uVar86 & 2 | puVar4[7] & uVar86;
                    puVar4 = (ushort *)((long)*ptr_00 + lVar30);
                    *puVar4 = uVar72;
                    puVar4[1] = uVar75;
                    puVar4[2] = uVar77;
                    puVar4[3] = uVar79;
                    puVar4[4] = uVar81;
                    puVar4[5] = uVar83;
                    puVar4[6] = uVar85;
                    puVar4[7] = uVar86;
                    puVar4 = (ushort *)((long)((result->field_4).rowcols)->score_row + lVar29);
                    *puVar4 = uVar72 | uVar73 & 0x78;
                    puVar4[1] = uVar75 | uVar76 & 0x78;
                    puVar4[2] = uVar77 | uVar78 & 0x78;
                    puVar4[3] = uVar79 | uVar80 & 0x78;
                    puVar4[4] = uVar81 | uVar82 & 0x78;
                    puVar4[5] = uVar83 | uVar84 & 0x78;
                    puVar4[6] = uVar85 | uVar1 & 0x78;
                    puVar4[7] = uVar86 | uVar2 & 0x78;
                    piVar10 = ((result->field_4).rowcols)->score_row;
                    puVar4 = (ushort *)((long)piVar10 + lVar29);
                    uVar73 = puVar4[1];
                    uVar76 = puVar4[2];
                    uVar78 = puVar4[3];
                    uVar80 = puVar4[4];
                    uVar82 = puVar4[5];
                    uVar84 = puVar4[6];
                    uVar1 = puVar4[7];
                    puVar5 = (ushort *)((long)piVar10 + lVar29);
                    *puVar5 = (*puVar4 & 0x1f | -(ushort)(auVar87._0_2_ < in_XMM3._0_2_) & 0x60) ^
                              0x40;
                    puVar5[1] = (uVar73 & 0x1f | -(ushort)(auVar87._2_2_ < in_XMM3._2_2_) & 0x60) ^
                                0x40;
                    puVar5[2] = (uVar76 & 0x1f | -(ushort)(auVar87._4_2_ < in_XMM3._4_2_) & 0x60) ^
                                0x40;
                    puVar5[3] = (uVar78 & 0x1f | -(ushort)(auVar87._6_2_ < in_XMM3._6_2_) & 0x60) ^
                                0x40;
                    puVar5[4] = (uVar80 & 0x1f | -(ushort)(auVar87._8_2_ < in_XMM3._8_2_) & 0x60) ^
                                0x40;
                    puVar5[5] = (uVar82 & 0x1f | -(ushort)(auVar87._10_2_ < in_XMM3._10_2_) & 0x60)
                                ^ 0x40;
                    puVar5[6] = (uVar84 & 0x1f | -(ushort)(auVar87._12_2_ < in_XMM3._12_2_) & 0x60)
                                ^ 0x40;
                    puVar5[7] = (uVar1 & 0x1f | -(ushort)(auVar87._14_2_ < in_XMM3._14_2_) & 0x60) ^
                                0x40;
                    auVar16._4_4_ = uVar39;
                    auVar16._0_4_ = uVar39;
                    auVar16._8_4_ = uVar39;
                    auVar16._12_4_ = uVar39;
                    in_XMM3 = psubsw(auVar74,auVar16);
                    auVar18._4_4_ = uVar40;
                    auVar18._0_4_ = uVar40;
                    auVar18._8_4_ = uVar40;
                    auVar18._12_4_ = uVar40;
                    auVar87 = psubsw(*(undefined1 (*) [16])((long)*ptr + lVar30),auVar18);
                    sVar11 = auVar87._0_2_;
                    sVar45 = in_XMM3._0_2_;
                    sVar64 = auVar87._2_2_;
                    sVar49 = in_XMM3._2_2_;
                    sVar12 = auVar87._4_2_;
                    sVar50 = in_XMM3._4_2_;
                    sVar69 = auVar87._6_2_;
                    sVar51 = in_XMM3._6_2_;
                    sVar13 = auVar87._8_2_;
                    sVar52 = in_XMM3._8_2_;
                    sVar70 = auVar87._10_2_;
                    sVar53 = in_XMM3._10_2_;
                    sVar14 = auVar87._12_2_;
                    sVar54 = in_XMM3._12_2_;
                    sVar55 = in_XMM3._14_2_;
                    sVar71 = auVar87._14_2_;
                    puVar4 = (ushort *)((long)*palVar24 + lVar30);
                    *puVar4 = (ushort)(sVar45 < sVar11) * sVar11 |
                              (ushort)(sVar45 >= sVar11) * sVar45;
                    puVar4[1] = (ushort)(sVar49 < sVar64) * sVar64 |
                                (ushort)(sVar49 >= sVar64) * sVar49;
                    puVar4[2] = (ushort)(sVar50 < sVar12) * sVar12 |
                                (ushort)(sVar50 >= sVar12) * sVar50;
                    puVar4[3] = (ushort)(sVar51 < sVar69) * sVar69 |
                                (ushort)(sVar51 >= sVar69) * sVar51;
                    puVar4[4] = (ushort)(sVar52 < sVar13) * sVar13 |
                                (ushort)(sVar52 >= sVar13) * sVar52;
                    puVar4[5] = (ushort)(sVar53 < sVar70) * sVar70 |
                                (ushort)(sVar53 >= sVar70) * sVar53;
                    puVar4[6] = (ushort)(sVar54 < sVar14) * sVar14 |
                                (ushort)(sVar54 >= sVar14) * sVar54;
                    puVar4[7] = (ushort)(sVar55 < sVar71) * sVar71 |
                                (ushort)(sVar55 >= sVar71) * sVar55;
                    if ((int)uVar35 < s2Len) {
                      puVar4 = (ushort *)((long)((result->field_4).rowcols)->score_row + lVar36);
                      *puVar4 = -(ushort)(sVar11 < sVar45) & 0x18 ^ 0x10;
                      puVar4[1] = -(ushort)(sVar64 < sVar49) & 0x18 ^ 0x10;
                      puVar4[2] = -(ushort)(sVar12 < sVar50) & 0x18 ^ 0x10;
                      puVar4[3] = -(ushort)(sVar69 < sVar51) & 0x18 ^ 0x10;
                      puVar4[4] = -(ushort)(sVar13 < sVar52) & 0x18 ^ 0x10;
                      puVar4[5] = -(ushort)(sVar70 < sVar53) & 0x18 ^ 0x10;
                      puVar4[6] = -(ushort)(sVar14 < sVar54) & 0x18 ^ 0x10;
                      puVar4[7] = -(ushort)(sVar71 < sVar55) & 0x18 ^ 0x10;
                    }
                    uVar56 = ((short)uVar56 < (short)auVar74._0_2_) * auVar74._0_2_ |
                             ((short)uVar56 >= (short)auVar74._0_2_) * uVar56;
                    uVar57 = ((short)uVar57 < (short)auVar74._2_2_) * auVar74._2_2_ |
                             ((short)uVar57 >= (short)auVar74._2_2_) * uVar57;
                    uVar58 = ((short)uVar58 < (short)auVar74._4_2_) * auVar74._4_2_ |
                             ((short)uVar58 >= (short)auVar74._4_2_) * uVar58;
                    uVar59 = ((short)uVar59 < (short)auVar74._6_2_) * auVar74._6_2_ |
                             ((short)uVar59 >= (short)auVar74._6_2_) * uVar59;
                    uVar60 = ((short)uVar60 < (short)auVar74._8_2_) * auVar74._8_2_ |
                             ((short)uVar60 >= (short)auVar74._8_2_) * uVar60;
                    uVar61 = ((short)uVar61 < (short)auVar74._10_2_) * auVar74._10_2_ |
                             ((short)uVar61 >= (short)auVar74._10_2_) * uVar61;
                    uVar62 = ((short)uVar62 < (short)auVar74._12_2_) * auVar74._12_2_ |
                             ((short)uVar62 >= (short)auVar74._12_2_) * uVar62;
                    uVar63 = ((short)uVar63 < (short)auVar74._14_2_) * auVar74._14_2_ |
                             ((short)uVar63 >= (short)auVar74._14_2_) * uVar63;
                    auVar19._4_4_ = uVar40;
                    auVar19._0_4_ = uVar40;
                    auVar19._8_4_ = uVar40;
                    auVar19._12_4_ = uVar40;
                    auVar89 = psubsw(auVar65,auVar19);
                    auVar44._0_2_ = -(ushort)(auVar89._0_2_ < sVar45);
                    auVar44._2_2_ = -(ushort)(auVar89._2_2_ < sVar49);
                    auVar44._4_2_ = -(ushort)(auVar89._4_2_ < sVar50);
                    auVar44._6_2_ = -(ushort)(auVar89._6_2_ < sVar51);
                    auVar44._8_2_ = -(ushort)(auVar89._8_2_ < sVar52);
                    auVar44._10_2_ = -(ushort)(auVar89._10_2_ < sVar53);
                    auVar44._12_2_ = -(ushort)(auVar89._12_2_ < sVar54);
                    auVar44._14_2_ = -(ushort)(auVar89._14_2_ < sVar55);
                    if ((ushort)((ushort)(SUB161(auVar44 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)((byte)(auVar44._14_2_ >> 7) & 1) << 0xe |
                                auVar44._14_2_ & 0x8000) == 0xffff) goto LAB_0061131c;
                    auVar87 = psubsw(auVar46,auVar19);
                    sVar11 = auVar87._0_2_;
                    auVar46._0_2_ =
                         (ushort)(sVar45 < sVar11) * sVar11 | (ushort)(sVar45 >= sVar11) * sVar45;
                    sVar11 = auVar87._2_2_;
                    auVar46._2_2_ =
                         (ushort)(sVar49 < sVar11) * sVar11 | (ushort)(sVar49 >= sVar11) * sVar49;
                    sVar11 = auVar87._4_2_;
                    auVar46._4_2_ =
                         (ushort)(sVar50 < sVar11) * sVar11 | (ushort)(sVar50 >= sVar11) * sVar50;
                    sVar11 = auVar87._6_2_;
                    auVar46._6_2_ =
                         (ushort)(sVar51 < sVar11) * sVar11 | (ushort)(sVar51 >= sVar11) * sVar51;
                    sVar11 = auVar87._8_2_;
                    auVar46._8_2_ =
                         (ushort)(sVar52 < sVar11) * sVar11 | (ushort)(sVar52 >= sVar11) * sVar52;
                    sVar11 = auVar87._10_2_;
                    auVar46._10_2_ =
                         (ushort)(sVar53 < sVar11) * sVar11 | (ushort)(sVar53 >= sVar11) * sVar53;
                    sVar11 = auVar87._12_2_;
                    auVar46._12_2_ =
                         (ushort)(sVar54 < sVar11) * sVar11 | (ushort)(sVar54 >= sVar11) * sVar54;
                    sVar11 = auVar87._14_2_;
                    auVar46._14_2_ =
                         (ushort)(sVar55 < sVar11) * sVar11 | (ushort)(sVar55 >= sVar11) * sVar55;
                    auVar66 = *(undefined1 (*) [16])((long)*palVar23 + lVar30);
                    lVar36 = lVar36 + 0x10;
                    lVar29 = lVar29 + 0x10;
                    lVar30 = lVar30 + 0x10;
                    auVar65 = auVar89;
                  }
                }
LAB_0061131c:
                auVar87 = auVar89;
                auVar47._0_2_ = -(ushort)((short)local_58._0_2_ < (short)uVar56);
                auVar47._2_2_ = -(ushort)((short)local_58._2_2_ < (short)uVar57);
                auVar47._4_2_ = -(ushort)((short)local_58._4_2_ < (short)uVar58);
                auVar47._6_2_ = -(ushort)((short)local_58._6_2_ < (short)uVar59);
                auVar47._8_2_ = -(ushort)((short)local_58._8_2_ < (short)uVar60);
                auVar47._10_2_ = -(ushort)((short)local_58._10_2_ < (short)uVar61);
                auVar47._12_2_ = -(ushort)((short)local_58._12_2_ < (short)uVar62);
                auVar47._14_2_ = -(ushort)((short)local_58._14_2_ < (short)uVar63);
                local_e0 = local_e0 + lVar32;
                lVar25 = lVar25 + lVar32;
                palVar20 = ptr;
                local_d8 = palVar23;
              } while ((((((((((((((((auVar47 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                    && (auVar47 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                   (auVar47 >> 0x17 & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar47 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar47 >> 0x27 & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar47 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar47 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar47 >> 0x3f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar47 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar47 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar47 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar47 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar47 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar47 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar47._14_2_ >> 7 & 1) == 0) && (auVar47._14_2_ & 0x8000) == 0);
              auVar48._0_2_ =
                   ((short)uVar60 < (short)uVar56) * uVar56 |
                   ((short)uVar60 >= (short)uVar56) * uVar60;
              auVar48._2_2_ =
                   ((short)uVar61 < (short)uVar57) * uVar57 |
                   ((short)uVar61 >= (short)uVar57) * uVar61;
              auVar48._4_2_ =
                   ((short)uVar62 < (short)uVar58) * uVar58 |
                   ((short)uVar62 >= (short)uVar58) * uVar62;
              auVar48._6_2_ =
                   ((short)uVar63 < (short)uVar59) * uVar59 |
                   ((short)uVar63 >= (short)uVar59) * uVar63;
              sVar11 = (0 < (short)uVar60) * uVar60;
              auVar48._8_2_ = sVar11;
              sVar64 = (0 < (short)uVar61) * uVar61;
              auVar48._10_2_ = sVar64;
              sVar12 = (0 < (short)uVar62) * uVar62;
              auVar48._12_2_ = sVar12;
              sVar69 = (0 < (short)uVar63) * uVar63;
              auVar48._14_2_ = sVar69;
              uVar73 = ((short)auVar48._4_2_ < (short)auVar48._0_2_) * auVar48._0_2_ |
                       ((short)auVar48._4_2_ >= (short)auVar48._0_2_) * auVar48._4_2_;
              uVar76 = ((short)auVar48._6_2_ < (short)auVar48._2_2_) * auVar48._2_2_ |
                       ((short)auVar48._6_2_ >= (short)auVar48._2_2_) * auVar48._6_2_;
              uVar78 = (sVar11 < (short)auVar48._4_2_) * auVar48._4_2_ |
                       (ushort)(sVar11 >= (short)auVar48._4_2_) * sVar11;
              uVar80 = (sVar64 < (short)auVar48._6_2_) * auVar48._6_2_ |
                       (ushort)(sVar64 >= (short)auVar48._6_2_) * sVar64;
              uVar82 = (ushort)(sVar12 < sVar11) * sVar11 | (ushort)(sVar12 >= sVar11) * sVar12;
              uVar84 = (ushort)(sVar69 < sVar64) * sVar64 | (ushort)(sVar69 >= sVar64) * sVar69;
              sVar12 = (ushort)(0 < sVar12) * sVar12;
              sVar69 = (ushort)(0 < sVar69) * sVar69;
              uVar73 = ((short)uVar76 < (short)uVar73) * uVar73 |
                       ((short)uVar76 >= (short)uVar73) * uVar76;
              auVar68._0_4_ =
                   CONCAT22(((short)uVar78 < (short)uVar76) * uVar76 |
                            ((short)uVar78 >= (short)uVar76) * uVar78,uVar73);
              auVar68._4_2_ =
                   ((short)uVar80 < (short)uVar78) * uVar78 |
                   ((short)uVar80 >= (short)uVar78) * uVar80;
              auVar68._6_2_ =
                   ((short)uVar82 < (short)uVar80) * uVar80 |
                   ((short)uVar82 >= (short)uVar80) * uVar82;
              auVar68._8_2_ =
                   ((short)uVar84 < (short)uVar82) * uVar82 |
                   ((short)uVar84 >= (short)uVar82) * uVar84;
              auVar68._10_2_ =
                   (sVar12 < (short)uVar84) * uVar84 | (ushort)(sVar12 >= (short)uVar84) * sVar12;
              auVar68._12_2_ =
                   (ushort)(sVar69 < sVar12) * sVar12 | (ushort)(sVar69 >= sVar12) * sVar69;
              auVar68._14_2_ = (ushort)(0 < sVar69) * sVar69;
              local_f4 = auVar68._0_4_;
              if ((short)(0x7ffe - (short)iVar22) < (short)uVar73) {
                *(byte *)&result->flag = (byte)result->flag | 0x40;
                local_b8 = SUB84(ptr,0);
                uStack_b4 = (undefined4)((ulong)ptr >> 0x20);
                ptr = palVar24;
                local_e8 = uVar34;
LAB_006113ba:
                if ((short)local_f4 == 0x7fff) {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                }
                iVar22 = parasail_result_is_saturated(result);
                iVar27 = 0;
                palVar24 = local_f0;
                palVar23 = local_d8;
                if (iVar22 == 0) {
                  iVar22 = (int)local_e8 + -1;
                  if (local_108 == (int)local_e8 + -2) {
                    palVar23 = local_f0;
                    palVar24 = local_d8;
                  }
                  if (local_108 == iVar22) {
                    palVar23 = local_d8;
                    palVar24 = b;
                  }
                  iVar33 = uVar7 - 1;
                  for (uVar37 = 0; (a & 0xfffffff) << 3 != (uint)uVar37; uVar37 = uVar37 + 1) {
                    if ((*(short *)((long)*palVar24 + uVar37 * 2) == (short)local_f4) &&
                       (iVar27 = ((uint)uVar37 & 7) * a + ((uint)(uVar37 >> 3) & 0x1fffffff),
                       iVar27 < iVar33)) {
                      iVar33 = iVar27;
                    }
                  }
                  if (local_108 == iVar22) {
                    b = local_f0;
                  }
                  iVar27 = (int)(short)local_f4;
                }
                else {
                  local_108 = 0;
                  iVar33 = 0;
                }
                result->score = iVar27;
                result->end_query = iVar33;
                result->end_ref = local_108;
                parasail_free(palVar24);
                parasail_free(ptr_00);
                parasail_free((void *)CONCAT44(uStack_b4,local_b8));
                parasail_free(ptr);
                parasail_free(b_00);
                parasail_free(palVar23);
                parasail_free(b);
                return result;
              }
              auVar65 = pshuflw(auVar48,auVar68,0);
              local_58._4_4_ = auVar65._0_4_;
              local_58._0_4_ = local_58._4_4_;
              local_58._8_4_ = local_58._4_4_;
              local_58._12_4_ = local_58._4_4_;
              local_108 = (int)uVar34;
            } while( true );
          }
          __format = "%s: %s must be >= 0\n";
          pcVar31 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_trace_striped_profile_sse2_128_16",pcVar31);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEaStore = NULL;
    __m128i* restrict pvEaLoad = NULL;
    __m128i* restrict pvHT = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    int16_t score = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int16_t maxp = 0;
    parasail_result_t *result = NULL;
    __m128i vTZero;
    __m128i vTIns;
    __m128i vTDel;
    __m128i vTDiag;
    __m128i vTDiagE;
    __m128i vTInsE;
    __m128i vTDiagF;
    __m128i vTDelF;
    __m128i vTMask;
    __m128i vFTMask;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    vZero = _mm_setzero_si128();
    score = NEG_INF;
    vMaxH = vZero;
    vMaxHUnit = vZero;
    maxp = INT16_MAX - (int16_t)(matrix->max+1);
    vTZero = _mm_set1_epi16(PARASAIL_ZERO);
    vTIns  = _mm_set1_epi16(PARASAIL_INS);
    vTDel  = _mm_set1_epi16(PARASAIL_DEL);
    vTDiag = _mm_set1_epi16(PARASAIL_DIAG);
    vTDiagE= _mm_set1_epi16(PARASAIL_DIAG_E);
    vTInsE = _mm_set1_epi16(PARASAIL_INS_E);
    vTDiagF= _mm_set1_epi16(PARASAIL_DIAG_F);
    vTDelF = _mm_set1_epi16(PARASAIL_DEL_F);
    vTMask = _mm_set1_epi16(PARASAIL_ZERO_MASK);
    vFTMask= _mm_set1_epi16(PARASAIL_F_MASK);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 16, sizeof(__m128i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);
    pvEaStore = parasail_memalign___m128i(16, segLen);
    pvEaLoad = parasail_memalign___m128i(16, segLen);
    pvHT = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEaStore) return NULL;
    if (!pvEaLoad) return NULL;
    if (!pvHT) return NULL;
    if (!pvHMax) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi16(-open), segLen);
    parasail_memset___m128i(pvEaStore, _mm_set1_epi16(-open), segLen);

    for (i=0; i<segLen; ++i) {
        arr_store(result->trace->trace_table, vTDiagE, i, segLen, 0);
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFa;
        __m128i vFa_ext;
        __m128i vH;
        __m128i vH_dag;
        const __m128i* vP = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = _mm_subs_epi16(vZero,vGapO);

        /* load final segment of pvHStore and shift left by 2 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 2);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            SWAP3(pvHMax,  pvHLoad,  pvHStore)
            SWAP(pvEaLoad,  pvEaStore)
        }
        else {
            /* Swap the 2 H buffers. */
            SWAP(pvHLoad,  pvHStore)
            SWAP(pvEaLoad,  pvEaStore)
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vH_dag = _mm_max_epi16(vH_dag, vZero);
            vH = _mm_max_epi16(vH_dag, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            {
                __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                __m128i cond_zero = _mm_cmpeq_epi16(vH, vZero);
                __m128i case1 = _mm_cmpeq_epi16(vH, vH_dag);
                __m128i case2 = _mm_cmpeq_epi16(vH, vF);
                __m128i vT = _mm_blendv_epi8_rpl(
                        _mm_blendv_epi8_rpl(vTIns, vTDel, case2),
                        _mm_blendv_epi8_rpl(vTDiag, vTZero, cond_zero),
                        case1);
                _mm_store_si128(pvHT + i, vT);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i, segLen, j);
            }
            vMaxH = _mm_max_epi16(vH, vMaxH);
            vEF_opn = _mm_subs_epi16(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vEF_opn, vE_ext);
            _mm_store_si128(pvE + i, vE);
            {
                __m128i vEa = _mm_load_si128(pvEaLoad + i);
                __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                _mm_store_si128(pvEaStore + i, vEa);
                if (j+1<s2Len) {
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                    arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                }
            }

            /* Update vF value. */
            vF_ext = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vEF_opn, vF_ext);
            if (i+1<segLen) {
                __m128i vTAll = arr_load(result->trace->trace_table, i+1, segLen, j);
                __m128i cond = _mm_cmpgt_epi16(vEF_opn, vF_ext);
                __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i+1, segLen, j);
            }

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        vFa_ext = vF_ext;
        vFa = vF;
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            vHp = _mm_slli_si128(vHp, 2);
            vEF_opn = _mm_slli_si128(vEF_opn, 2);
            vEF_opn = _mm_insert_epi16(vEF_opn, -open, 0);
            vF_ext = _mm_slli_si128(vF_ext, 2);
            vF_ext = _mm_insert_epi16(vF_ext, NEG_INF, 0);
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, -open, 0);
            vFa_ext = _mm_slli_si128(vFa_ext, 2);
            vFa_ext = _mm_insert_epi16(vFa_ext, NEG_INF, 0);
            vFa = _mm_slli_si128(vFa, 2);
            vFa = _mm_insert_epi16(vFa, -open, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                {
                    __m128i vTAll;
                    __m128i vT;
                    __m128i case1;
                    __m128i case2;
                    __m128i cond;
                    vHp = _mm_adds_epi16(vHp, _mm_load_si128(vP + i));
                    vHp = _mm_max_epi16(vHp, vZero);
                    case1 = _mm_cmpeq_epi16(vH, vHp);
                    case2 = _mm_cmpeq_epi16(vH, vF);
                    cond = _mm_andnot_si128(case1,case2);
                    vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    vT = _mm_load_si128(pvHT + i);
                    vT = _mm_blendv_epi8_rpl(vT, vTDel, cond);
                    _mm_store_si128(pvHT + i, vT);
                    vTAll = _mm_and_si128(vTAll, vTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vMaxH = _mm_max_epi16(vH, vMaxH);
                /* Update vF value. */
                {
                    __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    __m128i cond = _mm_cmpgt_epi16(vEF_opn, vFa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                    vTAll = _mm_and_si128(vTAll, vFTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vEF_opn = _mm_subs_epi16(vH, vGapO);
                vF_ext = _mm_subs_epi16(vF, vGapE);
                {
                    __m128i vEa = _mm_load_si128(pvEaLoad + i);
                    __m128i vEa_ext = _mm_subs_epi16(vEa, vGapE);
                    vEa = _mm_max_epi16(vEF_opn, vEa_ext);
                    _mm_store_si128(pvEaStore + i, vEa);
                    if (j+1<s2Len) {
                        __m128i cond = _mm_cmpgt_epi16(vEF_opn, vEa_ext);
                        __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                        arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                    }
                }
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi16(vF_ext, vEF_opn),
                                _mm_cmpeq_epi16(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi16(vEF_opn, vF_ext);*/
                vF = vF_ext;
                vFa_ext = _mm_subs_epi16(vFa, vGapE);
                vFa = _mm_max_epi16(vEF_opn, vFa_ext);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        {
            __m128i vCompare = _mm_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi16_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi16(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

    if (score == INT16_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = 0;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            SWAP(pvHMax,  pvHStore)
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            SWAP(pvHMax,  pvHLoad)
        }
        /* Trace the alignment ending position on read. */
        {
            int16_t *t = (int16_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvHMax);
    parasail_free(pvHT);
    parasail_free(pvEaLoad);
    parasail_free(pvEaStore);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}